

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

error * __thiscall parser::error::operator|=(error *this,error *o)

{
  ulong uVar1;
  ulong uVar2;
  ind iVar3;
  
  uVar1 = (o->pos).i;
  uVar2 = (this->pos).i;
  if (uVar2 <= uVar1) {
    if (uVar2 < uVar1) {
      (this->pos).cl = (o->pos).cl;
      iVar3 = (o->pos).ln;
      (this->pos).i = (o->pos).i;
      (this->pos).ln = iVar3;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->expected)._M_t,&(o->expected)._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&(this->messages)._M_t,&(o->messages)._M_t);
    }
    else {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->expected,
                 (o->expected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(o->expected)._M_t._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->messages,
                 (o->messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(o->messages)._M_t._M_impl.super__Rb_tree_header);
    }
  }
  return this;
}

Assistant:

error& operator |= (const error& o) {
			if ( pos > o.pos /* || o.empty() */ ) return *this;
			if ( pos < o.pos /* || empty() */ ) return *this = o;
			
			expected.insert(o.expected.begin(), o.expected.end());
			messages.insert(o.messages.begin(), o.messages.end());
			return *this;
		}